

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tanh_sinh_detail.hpp
# Opt level: O3

void __thiscall
boost::math::quadrature::detail::
tanh_sinh_detail<double,_boost::math::policies::policy<boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>_>
::prune_to_min_complement
          (tanh_sinh_detail<double,_boost::math::policies::policy<boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>_>
           *this,double *m)

{
  double dVar1;
  pointer pvVar2;
  pointer pvVar3;
  pointer pdVar4;
  pointer pdVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  pointer pdVar11;
  
  dVar1 = *m;
  if (8.900295434028806e-308 < dVar1) {
    pvVar2 = (this->m_abscissas).
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar8 = (long)(this->m_abscissas).
                  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar2;
    if (lVar8 != 0) {
      uVar7 = (lVar8 >> 3) * -0x5555555555555555;
      pvVar3 = (this->m_weights).
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar10 = 0;
      do {
        pdVar4 = *(pointer *)
                  &pvVar2[uVar10].super__Vector_base<double,_std::allocator<double>_>._M_impl;
        pdVar5 = *(pointer *)
                  ((long)&pvVar2[uVar10].super__Vector_base<double,_std::allocator<double>_>._M_impl
                  + 8);
        lVar8 = (long)pdVar5 - (long)pdVar4;
        if (lVar8 == 0) {
          return;
        }
        pdVar11 = pdVar4;
        uVar9 = lVar8 >> 3;
        while (uVar6 = uVar9, 0 < (long)uVar6) {
          uVar9 = uVar6 >> 1;
          if (dVar1 < ABS(pdVar11[uVar9])) {
            pdVar11 = pdVar11 + uVar9 + 1;
            uVar9 = ~uVar9 + uVar6;
          }
        }
        if (pdVar11 != pdVar5) {
          *(pointer *)
           ((long)&pvVar2[uVar10].super__Vector_base<double,_std::allocator<double>_>._M_impl + 8) =
               pdVar11;
          pdVar11 = (pointer)((long)pdVar11 +
                             (*(long *)&pvVar3[uVar10].
                                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                        super__Vector_impl_data - (long)pdVar4));
          if (pdVar11 !=
              *(pointer *)
               ((long)&pvVar3[uVar10].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data + 8)) {
            *(pointer *)
             ((long)&pvVar3[uVar10].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data + 8) = pdVar11;
          }
        }
        uVar10 = (ulong)((int)uVar10 + 1);
      } while (uVar10 <= uVar7 && uVar7 - uVar10 != 0);
    }
  }
  return;
}

Assistant:

void tanh_sinh_detail<Real, Policy>::prune_to_min_complement(const Real& m)
{
   //
   // If our tables were constructed from pre-computed data, then they will have more values stored than we can ever use,
   // and although the table size at this stage won't be too large, if we calculate down to m_max_levels then they will
   // grow by a huge amount - doubling in size at each step - so lets prune them down, removing values which will never
   // be used:
   //
   if (m > tools::min_value<Real>() * 4)
   {
      for (unsigned row = 0; (row < m_abscissas.size()) && m_abscissas[row].size(); ++row)
      {
         typename std::vector<Real>::iterator pos = std::lower_bound(m_abscissas[row].begin(), m_abscissas[row].end(), m, [](const Real& a, const Real& b) { using std::fabs; return fabs(a) > fabs(b); });
         if (pos != m_abscissas[row].end())
         {
            m_abscissas[row].erase(pos, m_abscissas[row].end());
            m_weights[row].erase(m_weights[row].begin() + m_abscissas[row].size(), m_weights[row].end());
         }
      }
   }
}